

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int btolower(bstring b)

{
  int iVar1;
  int iVar2;
  uchar local_24;
  int local_1c;
  int len;
  int i;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->mlen < b->slen)) ||
     ((b->slen < 0 || (b->mlen < 1)))) {
    b_local._4_4_ = -1;
  }
  else {
    local_1c = 0;
    iVar1 = b->slen;
    for (; local_1c < iVar1; local_1c = local_1c + 1) {
      if (b->data[local_1c] < 0x80) {
        iVar2 = tolower((uint)b->data[local_1c]);
        local_24 = (uchar)iVar2;
      }
      else {
        local_24 = b->data[local_1c];
      }
      b->data[local_1c] = local_24;
    }
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int btolower (bstring b) {
int i, len;
	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;
	for (i=0, len = b->slen; i < len; i++) {
		b->data[i] = (unsigned char) downcase (b->data[i]);
	}
	return 0;
}